

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

Symbol * createsymbol(char *symName)

{
  int iVar1;
  Symbol *sym_00;
  int *piVar2;
  char *pcVar3;
  Symbol *sym;
  char *symName_local;
  
  sym_00 = (Symbol *)malloc(0x140);
  if (sym_00 == (Symbol *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fatalerror("Failed to create symbol \'%s\': %s\n",symName,pcVar3);
  }
  iVar1 = snprintf((char *)sym_00,0x100,"%s",symName);
  if (0xff < iVar1) {
    warning(WARNING_LONG_STR,"Symbol name is too long: \'%s\'\n",symName);
  }
  sym_00->isExported = false;
  sym_00->isBuiltin = false;
  sym_00->hasCallback = false;
  sym_00->section = (Section *)0x0;
  setSymbolFilename(sym_00);
  sym_00->ID = 0xffffffff;
  sym_00->next = (Symbol *)0x0;
  hash_AddElement(symbols,(char *)sym_00,sym_00);
  return sym_00;
}

Assistant:

static struct Symbol *createsymbol(char const *symName)
{
	struct Symbol *sym = (struct Symbol *)malloc(sizeof(*sym));

	if (!sym)
		fatalerror("Failed to create symbol '%s': %s\n", symName, strerror(errno));

	if (snprintf(sym->name, MAXSYMLEN + 1, "%s", symName) > MAXSYMLEN)
		warning(WARNING_LONG_STR, "Symbol name is too long: '%s'\n", symName);

	sym->isExported = false;
	sym->isBuiltin = false;
	sym->hasCallback = false;
	sym->section = NULL;
	setSymbolFilename(sym);
	sym->ID = -1;
	sym->next = NULL;

	hash_AddElement(symbols, sym->name, sym);
	return sym;
}